

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::add_sample
          (TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation> *this,double t,
          FaceVaryingLinearInterpolation *v)

{
  Sample s;
  Sample local_18;
  
  local_18.blocked = false;
  local_18.value = *v;
  local_18.t = t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Sample>>
  ::
  emplace_back<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Sample>>
              *)this,&local_18);
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }